

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

uint nullcFindFunctionIndex(char *name)

{
  uint uVar1;
  ExternFuncInfo *pEVar2;
  uint index;
  uint i;
  uint index_00;
  bool bVar3;
  
  if (NULLC::linker == 0) {
    NULLC::nullcLastError = "ERROR: NULLC cannot find linked code";
  }
  else if (name == (char *)0x0) {
    NULLC::nullcLastError = "ERROR: function name is \'null\'";
  }
  else {
    index = 0xffffffff;
    uVar1 = NULLC::GetStringHash(name);
    for (index_00 = 0; index_00 < *(uint *)(NULLC::linker + 0x24c); index_00 = index_00 + 1) {
      pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                          index_00);
      if (((pEVar2->isVisible != 0) &&
          (pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                              ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                               index_00), pEVar2->nameHash == uVar1)) &&
         (bVar3 = index != 0xffffffff, index = index_00, bVar3)) {
        NULLC::nullcLastError = "ERROR: there is more than one function with the same name";
        return 0xffffffff;
      }
    }
    if (index == 0xffffffff) {
      NULLC::nullcLastError = "ERROR: function with such name cannot be found";
    }
    else {
      pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),index)
      ;
      if (pEVar2->funcCat == '\0') {
        return index;
      }
      NULLC::nullcLastError = "ERROR: function uses context, which is unavailable";
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcFindFunctionIndex(const char* name)
{
	using namespace NULLC;

	if(!linker)
	{
		nullcLastError = "ERROR: NULLC cannot find linked code";
		return ~0u;
	}
	if(!name)
	{
		nullcLastError = "ERROR: function name is 'null'";
		return ~0u;
	}
	unsigned hash = GetStringHash(name);
	unsigned index = ~0u;
	for(unsigned i = 0; i < linker->exFunctions.size(); i++)
	{
		if(linker->exFunctions[i].isVisible && linker->exFunctions[i].nameHash == hash)
		{
			if(index != ~0u)
			{
				nullcLastError = "ERROR: there is more than one function with the same name";
				return ~0u;
			}
			index = i;
		}
	}
	if(index == ~0u)
	{
		nullcLastError = "ERROR: function with such name cannot be found";
		return ~0u;
	}
	if(linker->exFunctions[index].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: function uses context, which is unavailable";
		return ~0u;
	}
	return index;
}